

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::filterIncludedFiles(MakefileGenerator *this,char *var)

{
  anon_class_8_1_8991fb9c_for__M_pred pred;
  long in_RDI;
  long in_FS_OFFSET;
  ProStringList *inputs;
  anon_class_8_1_8991fb9c_for__M_pred isIncluded;
  ProKey *v;
  QMakeProject *this_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  v = *(ProKey **)(in_RDI + 0xd8);
  this_00 = (QMakeProject *)&stack0xffffffffffffffc8;
  ProKey::ProKey((ProKey *)this_00,(char *)v);
  pred.this = (MakefileGenerator *)QMakeProject::values(this_00,v);
  ProKey::~ProKey((ProKey *)0x182ff0);
  QList<ProString>::removeIf<MakefileGenerator::filterIncludedFiles(char_const*)::__0>
            ((QList<ProString> *)this_00,pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::filterIncludedFiles(const char *var)
{
    ProStringList &inputs = project->values(var);
    auto isIncluded = [this](const ProString &input) {
        return QMakeSourceFileInfo::included(input.toQString()) > 0;
    };
    inputs.removeIf(isIncluded);
}